

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
          *f)

{
  long *plVar1;
  undefined1 uVar2;
  ulong uVar3;
  long lVar4;
  _List_node_base *p_Var5;
  ulong uVar6;
  ulong uVar7;
  char __tmp;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar7 = (ulong)spec->width_;
  uVar3 = f->size_;
  uVar10 = uVar3 - uVar7;
  if (uVar7 <= uVar3) {
LAB_001d5a1e:
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                  *)f,(back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)this
                );
    return;
  }
  uVar2 = (undefined1)spec->fill_;
  uVar9 = uVar7 - uVar3;
  if (spec->align_ == ALIGN_CENTER) {
    uVar6 = uVar9 >> 1;
    lVar4 = *(long *)this;
    uVar10 = uVar6;
    if (1 < uVar9) {
      do {
        p_Var5 = (_List_node_base *)operator_new(0x18);
        *(undefined1 *)&p_Var5[1]._M_next = uVar2;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        plVar1 = (long *)(lVar4 + 0x10);
        *plVar1 = *plVar1 + 1;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    *(long *)this = lVar4;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                  *)f,(back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)this
                );
    lVar4 = *(long *)this;
    if (uVar9 != uVar6) {
      lVar8 = (uVar3 + uVar6) - uVar7;
      do {
        p_Var5 = (_List_node_base *)operator_new(0x18);
        *(undefined1 *)&p_Var5[1]._M_next = uVar2;
        std::__detail::_List_node_base::_M_hook(p_Var5);
        plVar1 = (long *)(lVar4 + 0x10);
        *plVar1 = *plVar1 + 1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
    }
    *(long *)this = lVar4;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      lVar4 = *(long *)this;
      if (uVar9 != 0) {
        lVar8 = uVar3 - uVar7;
        do {
          p_Var5 = (_List_node_base *)operator_new(0x18);
          *(undefined1 *)&p_Var5[1]._M_next = uVar2;
          std::__detail::_List_node_base::_M_hook(p_Var5);
          plVar1 = (long *)(lVar4 + 0x10);
          *plVar1 = *plVar1 + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
      }
      *(long *)this = lVar4;
      goto LAB_001d5a1e;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                  *)f,(back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)this
                );
    lVar4 = *(long *)this;
    while (uVar9 != 0) {
      p_Var5 = (_List_node_base *)operator_new(0x18);
      *(undefined1 *)&p_Var5[1]._M_next = uVar2;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      plVar1 = (long *)(lVar4 + 0x10);
      *plVar1 = *plVar1 + 1;
      uVar10 = uVar10 + 1;
      uVar9 = uVar10;
    }
    *(long *)this = lVar4;
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }